

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O3

void __thiscall
fizplex::BaseTestRegularNoReordering_Invert_Test::~BaseTestRegularNoReordering_Invert_Test
          (BaseTestRegularNoReordering_Invert_Test *this)

{
  BaseTestRegularNoReordering::~BaseTestRegularNoReordering
            (&this->super_BaseTestRegularNoReordering);
  operator_delete(this,0x108);
  return;
}

Assistant:

TEST_F(BaseTestRegularNoReordering, Invert) {
  b.ftran(sv0);
  b.ftran(sv1);
  b.ftran(sv2);
  EXPECT_EQ(SVector({{0, -2}, {1, 3}, {2, 9}}), sv0);
  EXPECT_EQ(SVector({{0, 8}, {1, -11}, {2, -34}}), sv1);
  EXPECT_EQ(SVector({{0, -5}, {1, 7}, {2, 21}}), sv2);
}